

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

int glfwExtensionSupported(char *extension)

{
  int iVar1;
  undefined8 in_RAX;
  _GLFWwindow *p_Var2;
  GLubyte *pGVar3;
  uint uVar4;
  char *format;
  undefined8 uStack_28;
  GLint count;
  
  if (_glfwInitialized == '\0') {
    iVar1 = 0x10001;
  }
  else {
    uStack_28 = in_RAX;
    p_Var2 = _glfwPlatformGetCurrentContext();
    if (p_Var2 == (_GLFWwindow *)0x0) {
      iVar1 = 0x10002;
    }
    else {
      if ((extension != (char *)0x0) && (*extension != '\0')) {
        if (2 < p_Var2->glMajor) {
          glGetIntegerv(0x821d,&count);
          for (uVar4 = 0; (int)uVar4 < count; uVar4 = uVar4 + 1) {
            pGVar3 = (*p_Var2->GetStringi)(0x1f03,uVar4);
            if (pGVar3 == (GLubyte *)0x0) {
              _glfwInputError(0x10008,"Failed to retrieve extension string %i",(ulong)uVar4);
              return 0;
            }
            iVar1 = strcmp((char *)pGVar3,extension);
            if (iVar1 == 0) {
              return 1;
            }
          }
LAB_0010769d:
          iVar1 = _glfwPlatformExtensionSupported(extension);
          return iVar1;
        }
        pGVar3 = (GLubyte *)glGetString(0x1f03);
        if (pGVar3 != (GLubyte *)0x0) {
          iVar1 = _glfwStringInExtensionString(extension,pGVar3);
          if (iVar1 != 0) {
            return 1;
          }
          goto LAB_0010769d;
        }
        format = "Failed to retrieve extension string";
        iVar1 = 0x10008;
        goto LAB_00107649;
      }
      iVar1 = 0x10004;
    }
  }
  format = (char *)0x0;
LAB_00107649:
  _glfwInputError(iVar1,format);
  return 0;
}

Assistant:

GLFWAPI int glfwExtensionSupported(const char* extension)
{
    const GLubyte* extensions;
    _GLFWwindow* window;

    _GLFW_REQUIRE_INIT_OR_RETURN(GL_FALSE);

    window = _glfwPlatformGetCurrentContext();
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT, NULL);
        return GL_FALSE;
    }

    if (!extension || *extension == '\0')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GL_FALSE;
    }

    if (window->glMajor < 3)
    {
        // Check if extension is in the old style OpenGL extensions string

        extensions = glGetString(GL_EXTENSIONS);
        if (!extensions)
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Failed to retrieve extension string");
            return GL_FALSE;
        }

        if (_glfwStringInExtensionString(extension, extensions))
            return GL_TRUE;
    }
#if defined(_GLFW_USE_OPENGL)
    else
    {
        int i;
        GLint count;

        // Check if extension is in the modern OpenGL extensions string list

        glGetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
        {
            const char* en = (const char*) window->GetStringi(GL_EXTENSIONS, i);
            if (!en)
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Failed to retrieve extension string %i", i);
                return GL_FALSE;
            }

            if (strcmp(en, extension) == 0)
                return GL_TRUE;
        }
    }
#endif // _GLFW_USE_OPENGL

    // Check if extension is in the platform-specific string
    return _glfwPlatformExtensionSupported(extension);
}